

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O3

ImageLevel * __thiscall Imf_3_4::Image::level(Image *this,int lx,int ly)

{
  long lVar1;
  ImageLevel *pIVar2;
  ostream *poVar3;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((((-1 < lx) && (-1 < ly)) && (lVar1 = (this->_levels)._sizeY, (long)(ulong)(uint)lx < lVar1))
     && (((long)(ulong)(uint)ly < (this->_levels)._sizeX &&
         (pIVar2 = (this->_levels)._data[lVar1 * (ulong)(uint)ly + (ulong)(uint)lx],
         pIVar2 != (ImageLevel *)0x0)))) {
    return pIVar2;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Cannot access image level with invalid level number (",0x35);
  poVar3 = (ostream *)std::ostream::operator<<(local_190,lx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ly);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

ImageLevel&
Image::level (int lx, int ly)
{
    if (!levelNumberIsValid (lx, ly))
    {
        THROW (
            ArgExc,
            "Cannot access image level with invalid "
            "level number ("
                << lx << ", " << ly << ").");
    }

    return *_levels[ly][lx];
}